

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O2

void __thiscall
QItemDelegate::drawDisplay
          (QItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,QRect *rect,
          QString *text)

{
  QPalette *this_00;
  QTextLayout *pQVar1;
  ColorGroup CVar2;
  long lVar3;
  QItemDelegatePrivate *this_01;
  QWidget *this_02;
  undefined1 auVar4 [12];
  QString text_00;
  ColorRole cr;
  uint uVar5;
  Alignment AVar6;
  QStyle *pQVar7;
  qsizetype qVar8;
  ColorGroup cg;
  ColorGroup CVar9;
  int lineWidth;
  long in_FS_OFFSET;
  QSizeF QVar10;
  QString *this_03;
  QString *pQVar11;
  QStyleOptionViewItem *pQVar12;
  TextElideMode TVar13;
  qsizetype in_stack_fffffffffffffe38;
  QFontMetrics *pQVar14;
  QArrayDataPointer<char16_t> local_198;
  double local_180;
  Data *local_178;
  char16_t *local_170;
  QSize local_168;
  undefined1 local_160 [12];
  Representation RStack_154;
  QArrayDataPointer<QTextLayout::FormatRange> local_148;
  QArrayDataPointer<char16_t> local_130;
  QRect local_118;
  QStyleOptionViewItem opt;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QItemDelegatePrivate **)&(this->super_QAbstractItemDelegate).field_0x8;
  CVar2 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
          super_QFlagsStorage<QStyle::StateFlag>.i;
  CVar9 = Inactive;
  if ((CVar2 >> 0x10 & 1) != 0) {
    CVar9 = CVar2 & Disabled ^ Disabled;
  }
  cg = Disabled;
  if ((CVar2 & Disabled) != Active) {
    cg = CVar9;
  }
  this_00 = &(option->super_QStyleOption).palette;
  if ((short)CVar2 < 0) {
    QPalette::brush((ColorGroup)this_00,cg);
    QPainter::fillRect((QRect *)painter,(QBrush *)rect);
    cr = HighlightedText;
  }
  else {
    cr = Text;
  }
  QPalette::color(this_00,cg,cr);
  QPainter::setPen((QColor *)painter);
  if ((text->d).size == 0) goto LAB_00504c5f;
  if (((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 0x400000) != 0) {
    QPainter::save();
    QPalette::color(this_00,cg,Text);
    QPainter::setPen((QColor *)painter);
    opt.super_QStyleOption._0_16_ = QRect::adjusted(rect,0,0,-1,-1);
    QPainter::drawRect(painter,(QRect *)&opt);
    QPainter::restore();
  }
  memset(&opt,0xaa,0xd0);
  pQVar12 = option;
  QStyleOptionViewItem::QStyleOptionViewItem(&opt,option);
  this_02 = option->widget;
  if (this_02 == (QWidget *)0x0) {
    pQVar7 = QApplication::style();
  }
  else {
    pQVar7 = QWidget::style(this_02);
  }
  uVar5 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x41,0,this_02);
  local_118 = QRect::adjusted(rect,uVar5 + 1,0,~uVar5,0);
  auVar4 = local_118._0_12_;
  uVar5 = (uint)(((byte)opt.features.
                        super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
                        super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i & 1) == 0) *
          0x200 + (*(uint *)&this_01->textOption & 0xffffe1ff) + 0x200;
  *(uint *)&this_01->textOption = uVar5;
  *(LayoutDirection *)&this_01->textOption =
       uVar5 & 0xffff27ff |
       ((pQVar12->super_QStyleOption).direction & (LayoutDirectionAuto|RightToLeft)) << 0xe;
  AVar6 = QStyle::visualAlignment
                    ((pQVar12->super_QStyleOption).direction,
                     (Alignment)
                     (pQVar12->displayAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                     super_QFlagsStorage<Qt::AlignmentFlag>.i);
  *(uint *)&this_01->textOption =
       *(uint *)&this_01->textOption & 0xfffffe00 |
       (uint)AVar6.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1ff;
  pQVar1 = &this_01->textLayout;
  QTextLayout::setTextOption((QTextOption *)pQVar1);
  QTextLayout::setFont((QFont *)pQVar1);
  local_130.d = (text->d).d;
  local_130.ptr = (text->d).ptr;
  local_130.size = (text->d).size;
  if (local_130.d != (Data *)0x0) {
    LOCK();
    ((local_130.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_130.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    auVar4._4_4_ = 0;
    auVar4._0_4_ = local_118.x1.m_i;
    auVar4._8_4_ = local_118.x2.m_i;
  }
  text_00.d.ptr = (char16_t *)pQVar12;
  text_00.d.d = (Data *)text;
  text_00.d.size = in_stack_fffffffffffffe38;
  this_03 = text;
  QItemDelegatePrivate::replaceNewLine((QString *)&local_198,text_00);
  QTextLayout::setText((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_198);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_130);
  lineWidth = (auVar4._8_4_ - auVar4._0_4_) + 1;
  QVar10 = QItemDelegatePrivate::doTextLayout(this_01,lineWidth);
  if ((double)lineWidth < QVar10.wd) {
LAB_005048ae:
    local_198.d = (Data *)0x0;
    local_198.ptr = (char16_t *)0x0;
    local_198.size = 0;
    qVar8 = QString::indexOf(text,(QChar)0x2028,0,CaseSensitive);
    if ((int)qVar8 == -1) {
      QFontMetrics::elidedText
                ((QString *)&local_148,(int)pQVar12 + 0x20,(int)text,pQVar12->textElideMode);
      QString::append((QString *)&local_198);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
    }
    else {
      pQVar14 = &(pQVar12->super_QStyleOption).fontMetrics;
      pQVar11 = this_03;
      while( true ) {
        TVar13 = (TextElideMode)pQVar14;
        if ((int)qVar8 == -1) break;
        QString::mid((longlong)local_160,(longlong)this_03);
        QFontMetrics::elidedText
                  ((QString *)&local_148,(TextElideMode)pQVar14,
                   (int)(QArrayDataPointer<char16_t> *)local_160,pQVar12->textElideMode);
        QString::append((QString *)&local_198);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_160);
        QString::append((QChar)(char16_t)&local_198);
        qVar8 = QString::indexOf(this_03,(QChar)0x2028,(long)((int)qVar8 + 1),CaseSensitive);
      }
      QString::mid((longlong)local_160,(longlong)pQVar11);
      QFontMetrics::elidedText
                ((QString *)&local_148,TVar13,(int)(QArrayDataPointer<char16_t> *)local_160,
                 pQVar12->textElideMode);
      QString::append((QString *)&local_198);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_160);
    }
    QTextLayout::setText((QString *)pQVar1);
    QVar10 = QItemDelegatePrivate::doTextLayout(this_01,lineWidth);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_198);
  }
  else if ((double)((local_118.y2.m_i - local_118.y1.m_i) + 1) < QVar10.ht) goto LAB_005048ae;
  local_168.ht.m_i = (int)QVar10.ht;
  local_168.wd.m_i = lineWidth;
  _local_160 = QStyle::alignedRect((pQVar12->super_QStyleOption).direction,
                                   (Alignment)
                                   (pQVar12->displayAlignment).
                                   super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                                   super_QFlagsStorage<Qt::AlignmentFlag>.i,&local_168,&local_118);
  if (*(char *)(*(long *)&(this->super_QAbstractItemDelegate).field_0x8 + 0x80) == '\0') {
    if (QVar10.wd <= (double)((local_118.x2.m_i - local_118.x1.m_i) + 1)) {
      if (QVar10.ht <= (double)((local_118.y2.m_i - local_118.y1.m_i) + 1)) goto LAB_00504abe;
    }
    QPainter::save();
    QPainter::setClipRect((QRect *)painter,(ClipOperation)local_160);
    local_198.d = (Data *)(double)local_160._0_4_.m_i;
    local_198.ptr = (char16_t *)(double)local_160._4_4_.m_i;
    local_148.d = (Data *)0x0;
    local_148.ptr = (FormatRange *)0x0;
    local_148.size = 0;
    local_198.size =
         (qsizetype)(double)(((long)(int)local_160._8_4_ - (long)local_160._0_4_.m_i) + 1);
    local_180 = (double)(((long)RStack_154.m_i - ((long)local_160._0_8_ >> 0x20)) + 1);
    local_178 = local_198.d;
    local_170 = local_198.ptr;
    QTextLayout::draw((QPainter *)pQVar1,(QPointF *)painter,(QList_conflict *)&local_178,
                      (QRectF *)&local_148);
    QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer(&local_148);
    QPainter::restore();
  }
  else {
LAB_00504abe:
    local_198.d = (Data *)(double)local_160._0_4_.m_i;
    local_198.ptr = (char16_t *)(double)local_160._4_4_.m_i;
    local_148.d = (Data *)0x0;
    local_148.ptr = (FormatRange *)0x0;
    local_148.size = 0;
    local_198.size =
         (qsizetype)(double)(((long)local_160._8_4_.m_i - (long)local_160._0_4_.m_i) + 1);
    local_180 = (double)(((local_160._8_8_ >> 0x20) - (local_160._0_8_ >> 0x20)) + 1);
    local_178 = local_198.d;
    local_170 = local_198.ptr;
    QTextLayout::draw((QPainter *)pQVar1,(QPointF *)painter,(QList_conflict *)&local_178,
                      (QRectF *)&local_148);
    QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer(&local_148);
  }
  QStyleOptionViewItem::~QStyleOptionViewItem(&opt);
LAB_00504c5f:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemDelegate::drawDisplay(QPainter *painter, const QStyleOptionViewItem &option,
                                const QRect &rect, const QString &text) const
{
    Q_D(const QItemDelegate);

    QPalette::ColorGroup cg = option.state & QStyle::State_Enabled
                              ? QPalette::Normal : QPalette::Disabled;
    if (cg == QPalette::Normal && !(option.state & QStyle::State_Active))
        cg = QPalette::Inactive;
    if (option.state & QStyle::State_Selected) {
        painter->fillRect(rect, option.palette.brush(cg, QPalette::Highlight));
        painter->setPen(option.palette.color(cg, QPalette::HighlightedText));
    } else {
        painter->setPen(option.palette.color(cg, QPalette::Text));
    }

    if (text.isEmpty())
        return;

    if (option.state & QStyle::State_Editing) {
        painter->save();
        painter->setPen(option.palette.color(cg, QPalette::Text));
        painter->drawRect(rect.adjusted(0, 0, -1, -1));
        painter->restore();
    }

    const QStyleOptionViewItem opt = option;

    const QWidget *widget = d->widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();
    const int textMargin = style->pixelMetric(QStyle::PM_FocusFrameHMargin, nullptr, widget) + 1;
    QRect textRect = rect.adjusted(textMargin, 0, -textMargin, 0); // remove width padding
    const bool wrapText = opt.features & QStyleOptionViewItem::WrapText;
    d->textOption.setWrapMode(wrapText ? QTextOption::WordWrap : QTextOption::ManualWrap);
    d->textOption.setTextDirection(option.direction);
    d->textOption.setAlignment(QStyle::visualAlignment(option.direction, option.displayAlignment));
    d->textLayout.setTextOption(d->textOption);
    d->textLayout.setFont(option.font);
    d->textLayout.setText(QItemDelegatePrivate::replaceNewLine(text));

    QSizeF textLayoutSize = d->doTextLayout(textRect.width());

    if (textRect.width() < textLayoutSize.width()
        || textRect.height() < textLayoutSize.height()) {
        QString elided;
        int start = 0;
        int end = text.indexOf(QChar::LineSeparator, start);
        if (end == -1) {
            elided += option.fontMetrics.elidedText(text, option.textElideMode, textRect.width());
        } else {
            while (end != -1) {
                elided += option.fontMetrics.elidedText(text.mid(start, end - start),
                                                        option.textElideMode, textRect.width());
                elided += QChar::LineSeparator;
                start = end + 1;
                end = text.indexOf(QChar::LineSeparator, start);
            }
            //let's add the last line (after the last QChar::LineSeparator)
            elided += option.fontMetrics.elidedText(text.mid(start),
                                                    option.textElideMode, textRect.width());
        }
        d->textLayout.setText(elided);
        textLayoutSize = d->doTextLayout(textRect.width());
    }

    const QSize layoutSize(textRect.width(), int(textLayoutSize.height()));
    const QRect layoutRect = QStyle::alignedRect(option.direction, option.displayAlignment,
                                                  layoutSize, textRect);
    // if we still overflow even after eliding the text, enable clipping
    if (!hasClipping() && (textRect.width() < textLayoutSize.width()
                           || textRect.height() < textLayoutSize.height())) {
        painter->save();
        painter->setClipRect(layoutRect);
        d->textLayout.draw(painter, layoutRect.topLeft(), QList<QTextLayout::FormatRange>(),
                           layoutRect);
        painter->restore();
    } else {
        d->textLayout.draw(painter, layoutRect.topLeft(), QList<QTextLayout::FormatRange>(),
                           layoutRect);
    }
}